

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

int __thiscall IsoWriter::close(IsoWriter *this,int __fd)

{
  File *this_00;
  uint8_t *__s;
  int in_EAX;
  int extraout_EAX;
  ulong uVar1;
  int64_t iVar2;
  size_t in_RCX;
  size_t sVar3;
  int i;
  int __fd_00;
  int iVar4;
  bool bVar5;
  
  if (this->m_opened == true) {
    __s = this->m_buffer;
    memset(__s,0,0x800);
    this_00 = &this->m_file;
    while( true ) {
      uVar1 = File::size(this_00);
      __fd_00 = (int)__s;
      if ((uVar1 & 0x800000000000ffff) == 0xf800) break;
      File::write(this_00,__fd_00,(void *)0x800,in_RCX);
    }
    iVar2 = File::size(this_00);
    iVar4 = (int)(iVar2 / 0x800) + 1;
    this->m_metadataMirrorLBN = iVar4;
    this->m_tagLocationBaseAddr = this->m_partitionStartAddress;
    sVar3 = 0xfb;
    writeExtendedFileEntryDescriptor
              (this,false,'\0',MetadataMirror,(long)this->m_metadataFileLen,
               iVar4 - this->m_partitionStartAddress,0,(ExtentList *)0x0);
    memset(__s,0,0x800);
    for (iVar4 = 0; iVar4 < this->m_metadataFileLen / 0x800; iVar4 = iVar4 + 1) {
      File::write(this_00,__fd_00,(void *)0x800,sVar3);
    }
    iVar2 = File::size(this_00);
    sVar3 = 0x800;
    this->m_partitionEndAddress = (int)(iVar2 / 0x800);
    memset(__s,0,0x800);
    iVar4 = 0x20;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      File::write(this_00,__fd_00,(void *)0x800,sVar3);
    }
    allocateMetadata(this);
    this->m_tagLocationBaseAddr = this->m_metadataMirrorLBN;
    writeMetadata(this,this->m_metadataMirrorLBN);
    File::seek(this_00,0x90000,smBegin);
    this->m_tagLocationBaseAddr = this->m_partitionStartAddress;
    writeExtendedFileEntryDescriptor
              (this,false,'\0',Metadata,(long)this->m_metadataFileLen,
               this->m_metadataLBN - this->m_partitionStartAddress,0,(ExtentList *)0x0);
    this->m_tagLocationBaseAddr = this->m_metadataLBN;
    writeMetadata(this,this->m_metadataLBN);
    writeDescriptors(this);
    this->m_opened = false;
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void IsoWriter::close()
{
    if (!m_opened)
        return;

    memset(m_buffer, 0, sizeof(m_buffer));
    while (m_file.size() % ALLOC_BLOCK_SIZE != 1024LL * 62) m_file.write(m_buffer, SECTOR_SIZE);

    // mirror metadata file location and length
    m_metadataMirrorLBN = static_cast<int>(m_file.size() / SECTOR_SIZE + 1);
    m_tagLocationBaseAddr = m_partitionStartAddress;
    writeExtendedFileEntryDescriptor(false, 0, FileTypes::MetadataMirror, m_metadataFileLen,
                                     m_metadataMirrorLBN - m_partitionStartAddress, 0);

    // allocate space for metadata mirror file
    memset(m_buffer, 0, sizeof(m_buffer));
    for (int i = 0; i < m_metadataFileLen / SECTOR_SIZE; ++i) m_file.write(m_buffer, SECTOR_SIZE);

    m_partitionEndAddress = static_cast<int>(m_file.size() / SECTOR_SIZE);

    // reserve 64K for EOF anchor volume
    memset(m_buffer, 0, sizeof(m_buffer));
    for (int i = 0; i < 32; ++i) m_file.write(m_buffer, SECTOR_SIZE);

    allocateMetadata();

    m_tagLocationBaseAddr = m_metadataMirrorLBN;
    writeMetadata(m_metadataMirrorLBN);  // write metadata mirror file

    m_file.seek(1024LL * 576);
    // metadata file location and length (located at 576K, point to 640K address)
    m_tagLocationBaseAddr = m_partitionStartAddress;
    writeExtendedFileEntryDescriptor(false, 0, FileTypes::Metadata, m_metadataFileLen,
                                     m_metadataLBN - m_partitionStartAddress, 0);
    m_tagLocationBaseAddr = m_metadataLBN;  // Don't know why. Doing just as scenarist does
    writeMetadata(m_metadataLBN);

    writeDescriptors();
    m_opened = false;
}